

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O0

void __thiscall Solver::solveBFS(Solver *this)

{
  Block block;
  Block block_00;
  bool bVar1;
  reference board_00;
  size_type sVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  _Self local_648;
  _Self local_640;
  Board local_638;
  undefined1 local_550 [8];
  Board tempBoard_1;
  int local_44c;
  iterator iStack_448;
  int j_1;
  _Self local_440;
  Board local_438;
  undefined1 local_350 [8];
  Board tempBoard;
  int local_24c;
  int local_248;
  int j;
  int i;
  undefined1 local_158 [8];
  Board board;
  undefined1 local_60 [8];
  deque<Board,_std::allocator<Board>_> boards;
  Solver *this_local;
  
  boards.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)this;
  std::deque<Board,_std::allocator<Board>_>::deque((deque<Board,_std::allocator<Board>_> *)local_60)
  ;
  std::deque<Board,_std::allocator<Board>_>::push_back
            ((deque<Board,_std::allocator<Board>_> *)local_60,&this->board);
  do {
    bVar1 = std::deque<Board,_std::allocator<Board>_>::empty
                      ((deque<Board,_std::allocator<Board>_> *)local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    board_00 = std::deque<Board,_std::allocator<Board>_>::front
                         ((deque<Board,_std::allocator<Board>_> *)local_60);
    Board::Board((Board *)local_158,board_00);
    std::deque<Board,_std::allocator<Board>_>::pop_front
              ((deque<Board,_std::allocator<Board>_> *)local_60);
    bVar1 = Board::isCompleted((Board *)local_158);
    if (bVar1) {
      Board::Board((Board *)&i,(Board *)local_158);
      constructSolutionSteps(this,(Board *)&i);
      Board::~Board((Board *)&i);
      bVar1 = true;
    }
    else {
      for (local_248 = 0;
          sVar2 = std::vector<Block,_std::allocator<Block>_>::size
                            ((vector<Block,_std::allocator<Block>_> *)&board.field_0xc8),
          (ulong)(long)local_248 < sVar2; local_248 = local_248 + 1) {
        pvVar3 = std::vector<Block,_std::allocator<Block>_>::operator[]
                           ((vector<Block,_std::allocator<Block>_> *)&board.field_0xc8,
                            (long)local_248);
        bVar1 = Block::isHorizontal(pvVar3);
        if (bVar1) {
          for (local_24c = 0; local_24c < 2; local_24c = local_24c + 1) {
            pvVar3 = std::vector<Block,_std::allocator<Block>_>::operator[]
                               ((vector<Block,_std::allocator<Block>_> *)&board.field_0xc8,
                                (long)local_248);
            tempBoard.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = *(pointer *)pvVar3;
            block.id = pvVar3->id;
            block.row = pvVar3->row;
            block.column = pvVar3->column;
            block.length = pvVar3->length;
            block.direction = pvVar3->direction;
            bVar1 = Board::canMove((Board *)local_158,block,local_24c);
            if (bVar1) {
              Board::Board(&local_438,(Board *)local_158);
              createMovedInstance((Board *)local_350,this,&local_438,local_248,local_24c);
              Board::~Board(&local_438);
              local_440._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                   ::find(&this->pastSteps,(key_type *)(tempBoard.cells[5] + 4));
              iStack_448 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                           ::end(&this->pastSteps);
              bVar1 = std::operator==(&local_440,&stack0xfffffffffffffbb8);
              if (bVar1) {
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::operator[](&this->pastSteps,(key_type *)(tempBoard.cells[5] + 4));
                Board::operator=(pmVar4,(Board *)local_350);
                std::deque<Board,_std::allocator<Board>_>::push_back
                          ((deque<Board,_std::allocator<Board>_> *)local_60,(value_type *)local_350)
                ;
              }
              Board::~Board((Board *)local_350);
            }
          }
        }
        else {
          for (local_44c = 2; local_44c < 4; local_44c = local_44c + 1) {
            pvVar3 = std::vector<Block,_std::allocator<Block>_>::operator[]
                               ((vector<Block,_std::allocator<Block>_> *)&board.field_0xc8,
                                (long)local_248);
            tempBoard_1.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = *(pointer *)pvVar3;
            block_00.id = pvVar3->id;
            block_00.row = pvVar3->row;
            block_00.column = pvVar3->column;
            block_00.length = pvVar3->length;
            block_00.direction = pvVar3->direction;
            bVar1 = Board::canMove((Board *)local_158,block_00,local_44c);
            if (bVar1) {
              Board::Board(&local_638,(Board *)local_158);
              createMovedInstance((Board *)local_550,this,&local_638,local_248,local_44c);
              Board::~Board(&local_638);
              local_640._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                   ::find(&this->pastSteps,(key_type *)(tempBoard_1.cells[5] + 4));
              local_648._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                   ::end(&this->pastSteps);
              bVar1 = std::operator==(&local_640,&local_648);
              if (bVar1) {
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::operator[](&this->pastSteps,(key_type *)(tempBoard_1.cells[5] + 4));
                Board::operator=(pmVar4,(Board *)local_550);
                std::deque<Board,_std::allocator<Board>_>::push_back
                          ((deque<Board,_std::allocator<Board>_> *)local_60,(value_type *)local_550)
                ;
              }
              Board::~Board((Board *)local_550);
            }
          }
        }
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
               ::operator[](&this->pastSteps,(key_type *)(board.cells[5] + 4));
      Board::operator=(pmVar4,(Board *)local_158);
      bVar1 = false;
    }
    Board::~Board((Board *)local_158);
  } while (!bVar1);
  std::deque<Board,_std::allocator<Board>_>::~deque
            ((deque<Board,_std::allocator<Board>_> *)local_60);
  return;
}

Assistant:

void Solver::solveBFS() {
    deque<Board> boards;
    boards.push_back(this->board);

    // Loop over the queue until either the queue is empty or the solution is found.
    while (!boards.empty()) {

        // Get the next board and remove it from the list.
        Board board = boards.front();
        boards.pop_front();

        // Check if the board is solved completely.
        if (board.isCompleted()) {

            // The board is completed construct the solution steps.
            this->constructSolutionSteps(board);
            return;
        }

        // Construct the possible movement boards and push to the queue.
        for (int i = 0; i < board.blocks.size(); ++i) {
            if (board.blocks[i].isHorizontal()) {
                for (int j = LEFT; j <= RIGHT; ++j) {
                    // If the board can move, create the moved instance with appropriate referrer and identifier numbers.
                    if (board.canMove(board.blocks[i], j)) {
                        Board tempBoard = this->createMovedInstance(board, i, j);
                        if (this->pastSteps.find(tempBoard.identifier) == this->pastSteps.end()) {
                            this->pastSteps[tempBoard.identifier] = tempBoard;
                            boards.push_back(tempBoard);
                        }
                    }
                }
            } else {
                for (int j = UP; j <= DOWN; ++j) {
                    // If the board can move, create the moved instance with appropriate referrer and identifier numbers.
                    if (board.canMove(board.blocks[i], j)) {
                        Board tempBoard = this->createMovedInstance(board, i, j);
                        if (this->pastSteps.find(tempBoard.identifier) == this->pastSteps.end()) {
                            this->pastSteps[tempBoard.identifier] = tempBoard;
                            boards.push_back(tempBoard);
                        }
                    }
                }
            }
        }

        // Move the board to the past steps.
        this->pastSteps[board.identifier] = board;
    }
}